

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<float>::TPZFMatrix(TPZFMatrix<float> *this,void **vtt,int64_t rows,int64_t columns)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  void **in_stack_ffffffffffffffc8;
  TPZManVector<int,_5> *in_stack_ffffffffffffffd0;
  
  TPZMatrix<float>::TPZMatrix
            ((TPZMatrix<float> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int64_t)in_RDI
             ,(int64_t)in_RSI);
  *in_RDI = *in_RSI;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffffd0,(int64_t)(in_RDI + 7));
  TPZVec<float>::TPZVec((TPZVec<float> *)(in_RDI + 0xe));
  if (in_RDX * in_RCX != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDX * in_RCX;
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    in_RDI[4] = pvVar3;
  }
  return;
}

Assistant:

explicit inline  TPZFMatrix(const int64_t rows ,const int64_t columns = 1) : 
    TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),
    TPZMatrix<TVar>(rows,columns), fElem(0),fGiven(0),fSize(0) {
        if(rows*columns) fElem = new TVar[rows*columns];
    }